

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConstraintList * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConstraintList,std::span<slang::ast::Constraint_const*,18446744073709551615ul>>
          (BumpAllocator *this,span<const_slang::ast::Constraint_*,_18446744073709551615UL> *args)

{
  span<const_slang::ast::Constraint_*const,_18446744073709551615UL> list;
  ConstraintList *pCVar1;
  __extent_storage<18446744073709551615UL> in_RSI;
  BumpAllocator *in_RDI;
  ConstraintList *in_stack_ffffffffffffffe0;
  span<const_slang::ast::Constraint_*,_18446744073709551615UL> *in_stack_ffffffffffffffe8;
  
  pCVar1 = (ConstraintList *)
           allocate(in_RDI,in_RSI._M_extent_value,(size_t)in_stack_ffffffffffffffe8);
  std::span<const_slang::ast::Constraint_*const,_18446744073709551615UL>::
  span<const_slang::ast::Constraint_*,_18446744073709551615UL>
            ((span<const_slang::ast::Constraint_*const,_18446744073709551615UL> *)
             in_RSI._M_extent_value,in_stack_ffffffffffffffe8);
  list._M_extent._M_extent_value = in_RSI._M_extent_value;
  list._M_ptr = (pointer)in_stack_ffffffffffffffe8;
  ast::ConstraintList::ConstraintList(in_stack_ffffffffffffffe0,list);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }